

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-xref.c
# Opt level: O0

pdf_xref_entry * pdf_xref_find_subsection(hd_context *ctx,pdf_document *doc,int start,int len)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  pdf_xref *ppVar3;
  pdf_xref_entry *ppVar4;
  int local_3c;
  pdf_xref_subsec *ppStack_38;
  int num_objects;
  pdf_xref_subsec *sub;
  pdf_xref *xref;
  int len_local;
  int start_local;
  pdf_document *doc_local;
  hd_context *ctx_local;
  
  ppVar3 = doc->xref_sections + (doc->num_xref_sections + -1);
  for (ppStack_38 = ppVar3->subsec; ppStack_38 != (pdf_xref_subsec *)0x0;
      ppStack_38 = ppStack_38->next) {
    if ((ppStack_38->start <= start) && (start + len <= ppStack_38->start + ppStack_38->len)) {
      return ppStack_38->table + (start - ppStack_38->start);
    }
    if ((ppStack_38->start < start + len) && (start <= ppStack_38->start + ppStack_38->len)) break;
  }
  local_3c = ppVar3->num_objects;
  if (local_3c < start + len) {
    local_3c = start + len;
  }
  if (ppStack_38 == (pdf_xref_subsec *)0x0) {
    ppStack_38 = (pdf_xref_subsec *)hd_calloc(ctx,1,0x18);
    iVar2 = hd_push_try(ctx);
    if ((iVar2 != 0) && (iVar2 = __sigsetjmp(ctx->error->top->buffer,0), iVar2 == 0)) {
      ppVar4 = (pdf_xref_entry *)hd_calloc(ctx,(long)len,0x20);
      ppStack_38->table = ppVar4;
      ppStack_38->start = start;
      ppStack_38->len = len;
      ppStack_38->next = ppVar3->subsec;
      ppVar3->subsec = ppStack_38;
    }
    phVar1 = ctx->error->top;
    ctx->error->top = phVar1 + -1;
    if (1 < phVar1->code) {
      hd_free(ctx,ppStack_38);
      hd_rethrow(ctx);
    }
    ppVar3->num_objects = local_3c;
    if (doc->max_xref_len < local_3c) {
      extend_xref_index(ctx,doc,local_3c);
    }
  }
  else {
    ensure_solid_xref(ctx,doc,local_3c,doc->num_xref_sections + -1);
    ppStack_38 = doc->xref_sections[doc->num_xref_sections + -1].subsec;
  }
  return ppStack_38->table + (start - ppStack_38->start);
}

Assistant:

static pdf_xref_entry *
pdf_xref_find_subsection(hd_context *ctx, pdf_document *doc, int start, int len)
{
	pdf_xref *xref = &doc->xref_sections[doc->num_xref_sections-1];
	pdf_xref_subsec *sub;
	int num_objects;

	/* Different cases here. Case 1) We might be asking for a
	 * subsection (or a subset of a subsection) that we already
	 * have - Just return it. Case 2) We might be asking for a
	 * completely new subsection - Create it and return it.
	 * Case 3) We might have an overlapping one - Create a 'solid'
	 * subsection and return that. */

	/* Sanity check */
	for (sub = xref->subsec; sub != NULL; sub = sub->next)
	{
		if (start >= sub->start && start + len <= sub->start + sub->len)
			return &sub->table[start-sub->start]; /* Case 1 */
		if (start + len > sub->start && start <= sub->start + sub->len)
			break; /* Case 3 */
	}

	num_objects = xref->num_objects;
	if (num_objects < start + len)
		num_objects = start + len;

	if (sub == NULL)
	{
		/* Case 2 */
		sub = hd_malloc_struct(ctx, pdf_xref_subsec);
		hd_try(ctx)
		{
			sub->table = hd_calloc(ctx, len, sizeof(pdf_xref_entry));
			sub->start = start;
			sub->len = len;
			sub->next = xref->subsec;
			xref->subsec = sub;
		}
		hd_catch(ctx)
		{
			hd_free(ctx, sub);
			hd_rethrow(ctx);
		}
		xref->num_objects = num_objects;
		if (doc->max_xref_len < num_objects)
			extend_xref_index(ctx, doc, num_objects);
	}
	else
	{
		/* Case 3 */
		ensure_solid_xref(ctx, doc, num_objects, doc->num_xref_sections-1);
		xref = &doc->xref_sections[doc->num_xref_sections-1];
		sub = xref->subsec;
	}
	return &sub->table[start-sub->start];
}